

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  ssize_t sVar1;
  int *piVar2;
  long in_RSI;
  undefined8 in_RDI;
  uint64_t val;
  ssize_t r;
  uint n;
  char buf [1024];
  uv__async *wa;
  int local_42c;
  ulong local_428 [129];
  undefined8 *local_20;
  long local_10;
  undefined8 local_8;
  
  local_42c = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    do {
      sVar1 = read(*(int *)(local_10 + 0x30),local_428,0x400);
      if (0 < sVar1) {
        local_42c = local_42c + (int)sVar1;
      }
    } while (sVar1 == 0x400);
    if (((sVar1 != -1) || (piVar2 = __errno_location(), *piVar2 == 0xb)) ||
       (piVar2 = __errno_location(), *piVar2 == 0xb)) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      abort();
    }
  }
  local_20 = (undefined8 *)(local_10 + -8);
  if (*(int *)(local_10 + 0x38) == -1) {
    if (local_42c != 8) {
      __assert_fail("n == sizeof(val)","src/unix/async.c",0x9d,
                    "void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    (*(code *)*local_20)(local_8,local_20,local_428[0] & 0xffffffff);
  }
  else {
    (*(code *)*local_20)(local_8,local_20,local_42c);
  }
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  struct uv__async* wa;
  char buf[1024];
  unsigned n;
  ssize_t r;

  n = 0;
  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r > 0)
      n += r;

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  wa = container_of(w, struct uv__async, io_watcher);

#if defined(__linux__)
  if (wa->wfd == -1) {
    uint64_t val;
    assert(n == sizeof(val));
    memcpy(&val, buf, sizeof(val));  /* Avoid alignment issues. */
    wa->cb(loop, wa, val);
    return;
  }
#endif

  wa->cb(loop, wa, n);
}